

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

usize __thiscall Console::Prompt::Private::readBufferedUtf8Char(Private *this,char *buffer)

{
  Buffer *this_00;
  byte *pbVar1;
  code *pcVar2;
  int iVar3;
  usize uVar4;
  ssize_t sVar5;
  ulong size;
  char ch;
  
  pbVar1 = (this->bufferedInput).bufferStart;
  if (pbVar1 == (this->bufferedInput).bufferEnd) {
    sVar5 = read(0,&ch,1);
    if ((sVar5 != 1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x422,"read(STDIN_FILENO, &ch, 1) == 1"), iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (ch != '\x1b') {
      *buffer = ch;
      uVar4 = Unicode::length(ch);
      uVar4 = readUnbufferedUtf8Char(this,buffer,buffer + 1,uVar4);
      return uVar4;
    }
    *buffer = '\x1b';
    uVar4 = readUnbufferedEscapedSequence(this,buffer,buffer + 1);
  }
  else {
    this_00 = &this->bufferedInput;
    *buffer = *pbVar1;
    size = 1;
    Buffer::removeFront(this_00,1);
    if (*buffer != '\x1b') {
      uVar4 = Unicode::length(*buffer);
      while( true ) {
        if (uVar4 <= size) {
          buffer[size] = '\0';
          return uVar4;
        }
        pbVar1 = (this->bufferedInput).bufferStart;
        if (pbVar1 == (this->bufferedInput).bufferEnd) break;
        buffer[size] = *pbVar1;
        Buffer::removeFront(this_00,1);
        if (buffer[size] == '\x1b') {
          Buffer::Buffer((Buffer *)&ch,(byte *)buffer,size);
          *buffer = '\x1b';
          uVar4 = readBufferedEscapedSequence(this,buffer,buffer + 1);
          Buffer::prepend(this_00,(Buffer *)&ch);
          Buffer::~Buffer((Buffer *)&ch);
          return uVar4 + 1;
        }
        size = size + 1;
      }
      uVar4 = readUnbufferedUtf8Char(this,buffer,buffer + size,uVar4);
      return uVar4;
    }
    uVar4 = readBufferedEscapedSequence(this,buffer,buffer + 1);
  }
  return uVar4 + 1;
}

Assistant:

usize readBufferedUtf8Char(char* buffer)
  {
    if(bufferedInput.isEmpty())
    {
      char ch;
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      if(ch == '\x1b')
      {
        *buffer = '\x1b';
        return 1 + readUnbufferedEscapedSequence(buffer, buffer + 1);
      }
      *buffer = ch;
      return readUnbufferedUtf8Char(buffer, buffer + 1, Unicode::length(ch));
    }
    *buffer = *(const char*)(const byte*)bufferedInput;
    bufferedInput.removeFront(1);
    if(*buffer == '\x1b')
      return 1 + readBufferedEscapedSequence(buffer, buffer + 1);
    char* start = buffer;
    usize len = Unicode::length(*(buffer++));
    while((usize)(buffer - start) < len)
    {
      if(bufferedInput.isEmpty())
        return readUnbufferedUtf8Char(start, buffer, len);
      *buffer = *(const char*)(const byte*)bufferedInput;
      bufferedInput.removeFront(1);
      if(*buffer == '\x1b')
      {
        Buffer incompleteUtf8((const byte*)start, buffer - start);
        *start = '\x1b';
        usize result = 1 + readBufferedEscapedSequence(start, start + 1);
        bufferedInput.prepend(incompleteUtf8);
        return result;
      }
      ++buffer;
    }
    *buffer = '\0';
    return len;
  }